

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum_test.cpp
# Opt level: O2

void __thiscall Spectrum_SamplingPdfY_Test::TestBody(Spectrum_SamplingPdfY_Test *this)

{
  int iVar1;
  Message *message;
  char *message_00;
  undefined1 auVar2 [16];
  Float FVar3;
  Float FVar4;
  undefined1 auVar5 [16];
  float local_64;
  Stratified1DIter __begin1;
  Stratified1DIter __end1;
  AssertionResult gtest_ar;
  
  gtest_ar.success_ = true;
  gtest_ar._1_3_ = 3;
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pbrt::detail::IndexingGenerator<pbrt::Stratified1D,_pbrt::detail::Stratified1DIter>::begin
            (&__begin1,
             (IndexingGenerator<pbrt::Stratified1D,_pbrt::detail::Stratified1DIter> *)&gtest_ar);
  pbrt::detail::IndexingGenerator<pbrt::Stratified1D,_pbrt::detail::Stratified1DIter>::end
            (&__end1,(IndexingGenerator<pbrt::Stratified1D,_pbrt::detail::Stratified1DIter> *)
                     &gtest_ar);
  local_64 = 0.0;
  iVar1 = __begin1.super_RNGIterator<pbrt::detail::Stratified1DIter>.
          super_IndexingIterator<pbrt::detail::Stratified1DIter>.i;
  while (iVar1 != __end1.super_RNGIterator<pbrt::detail::Stratified1DIter>.
                  super_IndexingIterator<pbrt::detail::Stratified1DIter>.i) {
    FVar3 = pbrt::detail::Stratified1DIter::operator*(&__begin1);
    FVar3 = pbrt::SampleXYZMatching(FVar3);
    FVar4 = pbrt::XYZMatchingPDF(FVar3);
    if (0.0 < FVar4) {
      FVar3 = pbrt::DenselySampledSpectrum::operator()(pbrt::Spectra::y,FVar3);
      local_64 = local_64 + FVar3 / FVar4;
    }
    iVar1 = __begin1.super_RNGIterator<pbrt::detail::Stratified1DIter>.
            super_IndexingIterator<pbrt::detail::Stratified1DIter>.i + 1;
    __begin1.super_RNGIterator<pbrt::detail::Stratified1DIter>.
    super_IndexingIterator<pbrt::detail::Stratified1DIter>.i = iVar1;
  }
  __begin1.super_RNGIterator<pbrt::detail::Stratified1DIter>.
  super_IndexingIterator<pbrt::detail::Stratified1DIter>.i = -0x2d0e5604;
  __begin1.super_RNGIterator<pbrt::detail::Stratified1DIter>.
  super_IndexingIterator<pbrt::detail::Stratified1DIter>.n = 0x3f50624d;
  auVar5._0_4_ = (local_64 / 1000.0 + -106.856895) / 106.856895;
  auVar5._4_12_ = SUB6012((undefined1  [60])0x0,0);
  auVar2._8_4_ = 0x7fffffff;
  auVar2._0_8_ = 0x7fffffff7fffffff;
  auVar2._12_4_ = 0x7fffffff;
  auVar2 = vandps_avx512vl(auVar5,auVar2);
  __end1.super_RNGIterator<pbrt::detail::Stratified1DIter>.
  super_IndexingIterator<pbrt::detail::Stratified1DIter>.i = auVar2._0_4_;
  testing::internal::CmpHelperLT<float,double>
            ((internal *)&gtest_ar,"std::abs((yint - CIE_Y_integral) / CIE_Y_integral)","1e-3",
             (float *)&__end1,(double *)&__begin1);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&__begin1);
    std::ostream::operator<<
              ((void *)((long)__begin1.super_RNGIterator<pbrt::detail::Stratified1DIter>.
                              super_IndexingIterator<pbrt::detail::Stratified1DIter> + 0x10),
               local_64 / 1000.0);
    std::operator<<((ostream *)
                    ((long)__begin1.super_RNGIterator<pbrt::detail::Stratified1DIter>.
                           super_IndexingIterator<pbrt::detail::Stratified1DIter> + 0x10)," vs. ");
    message = testing::Message::operator<<((Message *)&__begin1,(float *)&pbrt::CIE_Y_integral);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message_00 = "";
    }
    else {
      message_00 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&__end1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/spectrum_test.cpp"
               ,0x87,message_00);
    testing::internal::AssertHelper::operator=((AssertHelper *)&__end1,message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&__end1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&__begin1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(Spectrum, SamplingPdfY) {
    // Make sure we can integrate the y matching curve correctly
    Float ysum = 0;
    int n = 1000;
    for (Float u : Stratified1D(n)) {
        Float lambda = SampleXYZMatching(u);
        Float pdf = XYZMatchingPDF(lambda);
        if (pdf > 0)
            ysum += Spectra::Y()(lambda) / pdf;
    }
    Float yint = ysum / n;

    EXPECT_LT(std::abs((yint - CIE_Y_integral) / CIE_Y_integral), 1e-3)
        << yint << " vs. " << CIE_Y_integral;
}